

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

bool __thiscall
flatbuffers::python::grpc::anon_unknown_0::ServiceGenerator::Generate(ServiceGenerator *this)

{
  bool bVar1;
  ostream *poVar2;
  vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_> *this_00;
  reference ppSVar3;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  string filename;
  ServiceDef *service;
  const_iterator __end3;
  const_iterator __begin3;
  vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_> *__range3;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  undefined1 local_28 [8];
  Imports imports;
  ServiceGenerator *this_local;
  
  imports.imports.
  super__Vector_base<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Imports::Imports((Imports *)local_28);
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"flatbuffers",(allocator<char> *)((long)&__range3 + 7));
  Imports::Import((Imports *)local_28,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
  if (((((this->super_BaseGenerator).parser_)->opts).grpc_python_typed_handlers & 1U) != 0) {
    poVar2 = std::operator<<(local_1a0,"def _serialize_to_bytes(table):\n");
    poVar2 = std::operator<<(poVar2,"  buf = table._tab.Bytes\n");
    poVar2 = std::operator<<(poVar2,
                             "  n = flatbuffers.encode.Get(flatbuffers.packer.uoffset, buf, 0)\n");
    poVar2 = std::operator<<(poVar2,"  if table._tab.Pos != n:\n");
    poVar2 = std::operator<<(poVar2,"    raise ValueError(\'must be a top-level table\')\n");
    poVar2 = std::operator<<(poVar2,"  return bytes(buf)\n");
    poVar2 = std::operator<<(poVar2,'\n');
    std::operator<<(poVar2,'\n');
  }
  this_00 = &(((this->super_BaseGenerator).parser_)->services_).vec;
  __end3 = std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>::begin
                     (this_00);
  service = (ServiceDef *)
            std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>::end
                      (this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<flatbuffers::ServiceDef_*const_*,_std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>_>
                                *)&service);
    if (!bVar1) break;
    ppSVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::ServiceDef_*const_*,_std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>_>
              ::operator*(&__end3);
    filename.field_2._8_8_ = *ppSVar3;
    GenerateStub(this,(stringstream *)local_1b0,(ServiceDef *)filename.field_2._8_8_,
                 (Imports *)local_28);
    GenerateServicer(this,(stringstream *)local_1b0,(ServiceDef *)filename.field_2._8_8_,
                     (Imports *)local_28);
    GenerateRegister(this,(stringstream *)local_1b0,(ServiceDef *)filename.field_2._8_8_,
                     (Imports *)local_28);
    __gnu_cxx::
    __normal_iterator<flatbuffers::ServiceDef_*const_*,_std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>_>
    ::operator++(&__end3);
  }
  StripExtension(&local_2c8,&((this->super_BaseGenerator).parser_)->file_being_parsed_);
  StripPath(&local_2a8,&local_2c8);
  std::operator+(&local_288,&(this->super_BaseGenerator).namer_.super_Namer.config_.output_path,
                 &local_2a8);
  std::operator+(&local_268,&local_288,"_grpc");
  std::operator+(&local_248,&local_268,
                 &(((this->super_BaseGenerator).parser_)->opts).grpc_filename_suffix);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                 &local_248,
                 &(this->super_BaseGenerator).namer_.super_Namer.config_.filename_extension);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::stringstream::str();
  bVar1 = SaveService((string *)local_228,(Imports *)local_28,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  Imports::~Imports((Imports *)local_28);
  return bVar1;
}

Assistant:

bool Generate() {
    Imports imports;
    std::stringstream ss;

    imports.Import("flatbuffers");

    if (parser_.opts.grpc_python_typed_handlers) {
      ss << "def _serialize_to_bytes(table):\n"
         << "  buf = table._tab.Bytes\n"
         << "  n = flatbuffers.encode.Get(flatbuffers.packer.uoffset, buf, 0)\n"
         << "  if table._tab.Pos != n:\n"
         << "    raise ValueError('must be a top-level table')\n"
         << "  return bytes(buf)\n"
         << '\n'
         << '\n';
    }

    for (const ServiceDef *service : parser_.services_.vec) {
      GenerateStub(ss, service, &imports);
      GenerateServicer(ss, service, &imports);
      GenerateRegister(ss, service, &imports);
    }

    std::string filename =
        namer_.config_.output_path +
        StripPath(StripExtension(parser_.file_being_parsed_)) + "_grpc" +
        parser_.opts.grpc_filename_suffix + namer_.config_.filename_extension;

    return SaveService(filename, imports, ss.str());
  }